

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::FreezeInternal
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this,
          DynamicObject *instance,bool isConvertedType)

{
  code *pcVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  undefined4 *puVar6;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar7;
  ScriptContext *requestContext;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_00;
  undefined1 local_40 [16];
  ArrayObject *objectArray;
  Type TStack_28;
  int index;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  Type TStack_18;
  bool isConvertedType_local;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this_local;
  
  AssertCount = AssertCount + 1;
  descriptor._7_1_ = isConvertedType;
  TStack_18.ptr = (RuntimeFunction *)instance;
  instance_local = (DynamicObject *)this;
  Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                              ,0x88a,"(IsNotExtensibleSupported)",
                              "This method must not be called for SimpleDictionaryTypeHandler<TPropertyIndex, IsNotExtensibleSupported = false>"
                             );
  if (!bVar3) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 0;
  DynamicTypeHandler::ChangeFlags(&this->super_DynamicTypeHandler,0xc1,0xc0);
  TStack_28.ptr = (RuntimeFunction *)0x0;
  objectArray._4_4_ = 0;
  while( true ) {
    iVar2 = objectArray._4_4_;
    pBVar7 = Memory::
             WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
             ::operator->(&this->propertyMap);
    iVar5 = JsUtil::
            BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
            ::Count(pBVar7);
    if (iVar5 <= iVar2) break;
    pBVar7 = Memory::
             WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
             ::operator->(&this->propertyMap);
    TStack_28.ptr =
         (RuntimeFunction *)
         JsUtil::
         BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
         ::GetReferenceAt(pBVar7,objectArray._4_4_);
    if (((ulong)((TStack_28.ptr)->super_JavascriptFunction).super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject & 0x1000) == 0) {
      *(byte *)((long)&((TStack_28.ptr)->super_JavascriptFunction).super_DynamicObject.
                       super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                       _vptr_IRecyclerVisitedObject + 1) =
           *(PropertyAttributes *)
            ((long)&((TStack_28.ptr)->super_JavascriptFunction).super_DynamicObject.
                    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject + 1) & 0xf9;
    }
    objectArray._4_4_ = objectArray._4_4_ + 1;
  }
  if ((descriptor._7_1_ & 1) == 0) {
    DynamicObject::ChangeType((DynamicObject *)TStack_18.ptr);
  }
  local_40._8_8_ = DynamicObject::GetObjectArray((DynamicObject *)TStack_18.ptr);
  if ((GlobalObject *)local_40._8_8_ != (GlobalObject *)0x0) {
    (*(((GlobalObject *)local_40._8_8_)->super_RootObjectBase).super_DynamicObject.
      super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x38])();
  }
  DynamicTypeHandler::ClearHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler);
  bVar4 = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
  if ((bVar4 & 0x20) != 0) {
    requestContext = RecyclableObject::GetScriptContext((RecyclableObject *)TStack_18.ptr);
    DynamicTypeHandler::InvalidateStoreFieldCachesForAllProperties
              (&this->super_DynamicTypeHandler,requestContext);
    RecyclableObject::GetLibrary((RecyclableObject *)TStack_18.ptr);
    JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
              ((JavascriptLibrary *)local_40);
    this_00 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
              operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *
                         )local_40);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(this_00);
  }
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::FreezeInternal(DynamicObject* instance, bool isConvertedType)
    {
        AssertMsg(IsNotExtensibleSupported, "This method must not be called for SimpleDictionaryTypeHandler<TPropertyIndex, IsNotExtensibleSupported = false>");

        this->ChangeFlags(IsExtensibleFlag | IsSealedOnceFlag | IsFrozenOnceFlag,
            0 | IsSealedOnceFlag | IsFrozenOnceFlag);

        //Set [[Writable]] flag of each property to false except for setter\getters
        //Set [[Configurable]] flag of each property to false
        SimpleDictionaryPropertyDescriptor<TPropertyIndex> *descriptor = nullptr;
        for (TPropertyIndex index = 0; index < propertyMap->Count(); index++)
        {
            descriptor = propertyMap->GetReferenceAt(index);
            if (!(descriptor->Attributes & PropertyLetConstGlobal))
            {
                descriptor->Attributes &= ~(PropertyWritable | PropertyConfigurable);
            }
        }

        if (!isConvertedType)
        {
            // Change of [[Writable]] property requires cache invalidation, hence ChangeType
            instance->ChangeType();
        }

        ArrayObject * objectArray = instance->GetObjectArray();
        if (objectArray)
        {
            objectArray->Freeze();
        }

        this->ClearHasOnlyWritableDataProperties();
        if (GetFlags() & IsPrototypeFlag)
        {
            InvalidateStoreFieldCachesForAllProperties(instance->GetScriptContext());
            instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
        }

        return TRUE;
    }